

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O3

void __thiscall EventLoop::wakeup(EventLoop *this)

{
  char *pcVar1;
  ssize_t v;
  LogStream *pLVar2;
  char **ppcVar3;
  Logger local_ff0;
  undefined8 local_18;
  uint64_t one;
  
  local_18 = 1;
  v = writen(this->wakeupFd_,&local_18,8);
  if (v != 8) {
    Logger::Logger(&local_ff0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Ventery[P]WebServer/WebServer/EventLoop.cpp"
                   ,0x3d);
    if (0x1b < ((int)&local_ff0 + 0xfa8) - (int)local_ff0.impl_.stream_.buffer_.cur_) {
      builtin_strncpy(local_ff0.impl_.stream_.buffer_.cur_,"EventLoop::wakeup() writes ",0x1b);
      local_ff0.impl_.stream_.buffer_.cur_ = local_ff0.impl_.stream_.buffer_.cur_ + 0x1b;
    }
    pLVar2 = LogStream::operator<<((LogStream *)&local_ff0,v);
    ppcVar3 = &(pLVar2->buffer_).cur_;
    pcVar1 = (pLVar2->buffer_).cur_;
    if (0x13 < (int)ppcVar3 - (int)pcVar1) {
      builtin_strncpy(pcVar1," bytes instead of 8",0x13);
      *ppcVar3 = *ppcVar3 + 0x13;
    }
    Logger::~Logger(&local_ff0);
  }
  return;
}

Assistant:

void EventLoop::wakeup() {
  uint64_t one = 1;
  ssize_t n = writen(wakeupFd_, (char*)(&one), sizeof one);
  if (n != sizeof one) {
    LOG << "EventLoop::wakeup() writes " << n << " bytes instead of 8";
  }
}